

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

bool __thiscall ConditionalExecution::testOpRead(ConditionalExecution *this,Varnode *vn,PcodeOp *op)

{
  bool bVar1;
  OpCode OVar2;
  int4 iVar3;
  BlockBasic *pBVar4;
  Varnode *pVVar5;
  PcodeOp *pPVar6;
  PcodeOp *upop;
  Varnode *invn;
  PcodeOp *copyop;
  PcodeOp *op_local;
  Varnode *vn_local;
  ConditionalExecution *this_local;
  
  copyop = op;
  op_local = (PcodeOp *)vn;
  vn_local = (Varnode *)this;
  pBVar4 = PcodeOp::getParent(op);
  if (pBVar4 == this->iblock) {
    return true;
  }
  OVar2 = PcodeOp::code(copyop);
  if ((OVar2 == CPUI_RETURN) && ((this->directsplit & 1U) == 0)) {
    iVar3 = PcodeOp::numInput(copyop);
    if ((iVar3 < 2) || (pVVar5 = PcodeOp::getIn(copyop,1), pVVar5 != (Varnode *)op_local)) {
      return false;
    }
    pPVar6 = Varnode::getDef((Varnode *)op_local);
    OVar2 = PcodeOp::code(pPVar6);
    if (OVar2 == CPUI_COPY) {
      pVVar5 = PcodeOp::getIn(pPVar6,0);
      bVar1 = Varnode::isWritten(pVVar5);
      if (!bVar1) {
        return false;
      }
      pPVar6 = Varnode::getDef(pVVar5);
      pBVar4 = PcodeOp::getParent(pPVar6);
      if ((pBVar4 == this->iblock) && (OVar2 = PcodeOp::code(pPVar6), OVar2 != CPUI_MULTIEQUAL)) {
        return false;
      }
      std::vector<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(&this->returnop,&copyop);
      return true;
    }
  }
  return false;
}

Assistant:

bool ConditionalExecution::testOpRead(Varnode *vn,PcodeOp *op)

{
  if (op->getParent() == iblock) return true;
  if ((op->code() == CPUI_RETURN)&&(!directsplit)) {
    if ((op->numInput() < 2)||(op->getIn(1) != vn)) return false; // Only test for flow thru to return value
    PcodeOp *copyop = vn->getDef();
    if (copyop->code() == CPUI_COPY) {
      // Ordinarily, if -vn- is produced by a COPY we want to return false here because the propagation
      // hasn't had time to happen here.  But if the flow is into a RETURN this can't propagate, so
      // we allow this as a read that can be altered.  (We have to move the COPY)
      Varnode *invn = copyop->getIn(0);
      if (!invn->isWritten()) return false;
      PcodeOp *upop = invn->getDef();
      if ((upop->getParent() == iblock)&&(upop->code() != CPUI_MULTIEQUAL))
	return false;
      returnop.push_back(op);
      return true;
    }
  }
  return false;
}